

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen9Resource_Test1DLinearResourceArrays_Test::TestBody
          (CTestGen9Resource_Test1DLinearResourceArrays_Test *this)

{
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined4 uStack_70;
  int iStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uStack_40 = 0;
  local_78 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_88 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  local_b0 = 1;
  local_48 = 0x100000000;
  local_a0 = 0x80000;
  local_a8 = 0x400000000;
  uStack_70 = 0;
  iStack_6c = 4;
  lVar3 = 0;
  do {
    local_ac = *(undefined4 *)((long)&DAT_001a7f2c + lVar3);
    uStack_80 = 0x1001;
    local_78 = CONCAT44(local_78._4_4_,1);
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&local_b0);
    uVar1 = (int)uStack_80 + 0x3fU & 0xffffffc0;
    iVar2 = *(int *)((long)&DAT_001a7f18 + lVar3) * uVar1 * iStack_6c;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo,0x40);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,ResourceInfo,(ulong)(iVar2 + 0xfffU & 0xfffff000));
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,ResourceInfo,(ulong)uVar1);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    lVar3 = lVar3 + 4;
  } while ((int)lVar3 != 0x14);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DLinearResourceArrays)
{
    // Horizontal pixel alignment
    const uint32_t HAlign = 64;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.ArraySize            = 4;

    // Allocate more than 1 page
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1001;
        gmmParams.BaseHeight  = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes * gmmParams.ArraySize, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<true>(ResourceInfo, AlignedWidth);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}